

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Track.cpp
# Opt level: O1

Track * __thiscall Track::format(Track *this,CylHead *cylhead,Format *fmt)

{
  pointer pSVar1;
  pointer pSVar2;
  int iVar3;
  pointer pSVar4;
  pointer piVar5;
  Data data;
  Sector sector;
  Header header;
  allocator_type local_c9;
  Track *local_c8;
  uint8_t *local_c0;
  int *local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  vector<int,_std::allocator<int>_> local_98;
  Sector local_80;
  Header local_40;
  
  if (fmt->sectors == 0) {
    __assert_fail("fmt.sectors != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/Track.cpp"
                  ,0xf9,"Track &Track::format(const CylHead &, const Format &)");
  }
  pSVar1 = (this->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar2 = (this->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar4 = pSVar1;
  local_c8 = this;
  if (pSVar2 != pSVar1) {
    do {
      std::vector<Data,_std::allocator<Data>_>::~vector(&pSVar4->m_data);
      pSVar4 = pSVar4 + 1;
    } while (pSVar4 != pSVar2);
    (local_c8->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar1;
  }
  std::vector<Sector,_std::allocator<Sector>_>::reserve(&this->m_sectors,(long)fmt->sectors);
  Format::get_ids(&local_98,fmt,cylhead);
  local_b8 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_c0 = &fmt->fill;
    piVar5 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      Header::Header(&local_40,cylhead->cyl,(&fmt->head0)[cylhead->head != 0],*piVar5,fmt->size);
      Sector::Sector(&local_80,fmt->datarate,fmt->encoding,&local_40,fmt->gap3);
      iVar3 = Format::sector_size(fmt);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_b0,(long)iVar3,local_c0,&local_c9);
      Sector::add(&local_80,(Data *)&local_b0,false,0xfb);
      add(local_c8,&local_80);
      if (local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_b0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<Data,_std::allocator<Data>_>::~vector(&local_80.m_data);
      piVar5 = piVar5 + 1;
    } while (piVar5 != local_b8);
  }
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_c8;
}

Assistant:

Track& Track::format(const CylHead& cylhead, const Format& fmt)
{
    assert(fmt.sectors != 0);

    m_sectors.clear();
    m_sectors.reserve(fmt.sectors);

    for (auto id : fmt.get_ids(cylhead))
    {
        Header header(cylhead.cyl, cylhead.head ? fmt.head1 : fmt.head0, id, fmt.size);
        Sector sector(fmt.datarate, fmt.encoding, header, fmt.gap3);
        Data data(fmt.sector_size(), fmt.fill);

        sector.add(std::move(data));
        add(std::move(sector));
    }

    return *this;
}